

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemInfo.Common.cpp
# Opt level: O0

bool PlatformAgnostic::SystemInfo::GetBinaryLocation(char16 *path,uint size)

{
  LPCUTF8 puVar1;
  char16 *buffer;
  bool bVar2;
  size_t sVar3;
  size_t sVar4;
  LPCUTF8 local_28;
  char *tmp;
  int tmp_size;
  uint size_local;
  char16 *path_local;
  
  tmp._0_4_ = size * 3;
  tmp._4_4_ = size;
  _tmp_size = path;
  local_28 = (LPCUTF8)malloc((long)(int)(uint)tmp);
  bVar2 = GetBinaryLocation((char *)local_28,(uint)tmp);
  buffer = _tmp_size;
  puVar1 = local_28;
  if (bVar2) {
    sVar3 = strlen((char *)local_28);
    sVar4 = utf8::DecodeUnitsIntoAndNullTerminate
                      (buffer,&local_28,puVar1 + sVar3,doDefault,(bool *)0x0);
    if (sVar4 == 0) {
      free(local_28);
      wcscpy_s(_tmp_size,(ulong)tmp._4_4_,
               L"GetBinaryLocation: DecodeUnitsIntoAndNullTerminate has failed.");
      path_local._7_1_ = false;
    }
    else {
      free(local_28);
      path_local._7_1_ = true;
    }
  }
  else {
    free(local_28);
    path_local._7_1_ = false;
  }
  return path_local._7_1_;
}

Assistant:

bool SystemInfo::GetBinaryLocation(char16 *path, const unsigned size)
    {
        int tmp_size = size * 3;
        char *tmp = (char*)malloc(tmp_size);
        if (!GetBinaryLocation(tmp, tmp_size))
        {
            free(tmp);
            return false;
        }
        if (utf8::DecodeUnitsIntoAndNullTerminate(path, (LPCUTF8&)tmp, (LPCUTF8)tmp + strlen(tmp)) <= 0)
        {
            free(tmp);
            wcscpy_s(path, size, _u("GetBinaryLocation: DecodeUnitsIntoAndNullTerminate has failed."));
            return false;
        }
        free(tmp);
        return true;
    }